

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_collapse.c
# Opt level: O1

REF_STATUS
ref_collapse_edge_same_tangent(REF_GRID ref_grid,REF_INT keep,REF_INT remove,REF_BOOL *allowed)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_DBL *pRVar2;
  REF_ADJ_ITEM pRVar3;
  uint uVar4;
  int iVar5;
  REF_STATUS RVar6;
  long lVar7;
  ulong uVar8;
  REF_INT cell;
  REF_DBL tangent1 [3];
  REF_DBL tangent0 [3];
  REF_INT nodes [27];
  double local_e8 [4];
  double local_c8 [4];
  REF_INT local_a8 [30];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[0];
  *allowed = 1;
  uVar8 = 0xffffffff;
  if (-1 < remove) {
    uVar8 = 0xffffffff;
    if (remove < ref_cell->ref_adj->nnode) {
      uVar8 = (ulong)(uint)ref_cell->ref_adj->first[(uint)remove];
    }
  }
  if ((int)uVar8 != -1) {
    cell = ref_cell->ref_adj->item[(int)uVar8].ref;
    do {
      lVar7 = (long)cell * (long)ref_cell->size_per;
      if ((ref_cell->c2n[lVar7] != keep) && (ref_cell->c2n[lVar7 + 1] != keep)) {
        uVar4 = ref_cell_nodes(ref_cell,cell,local_a8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x454,"ref_collapse_edge_same_tangent",(ulong)uVar4,"nodes");
          return uVar4;
        }
        iVar5 = -1;
        if (0 < (long)ref_cell->node_per) {
          lVar7 = 0;
          do {
            if (local_a8[lVar7] != remove) {
              iVar5 = local_a8[lVar7];
            }
            lVar7 = lVar7 + 1;
          } while (ref_cell->node_per != lVar7);
        }
        if (iVar5 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x45b,"ref_collapse_edge_same_tangent","other not found");
          return 1;
        }
        pRVar2 = pRVar1->real;
        lVar7 = 0;
        do {
          local_c8[lVar7] = pRVar2[remove * 0xf + lVar7] - pRVar2[iVar5 * 0xf + lVar7];
          local_e8[lVar7] = pRVar2[keep * 0xf + lVar7] - pRVar2[iVar5 * 0xf + lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        uVar4 = ref_math_normalize(local_c8);
        if (uVar4 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_collapse.c"
                 ,0x462,"ref_collapse_edge_same_tangent",(ulong)uVar4,"zero length orig quad");
          return uVar4;
        }
        RVar6 = ref_math_normalize(local_e8);
        if ((RVar6 == 4) ||
           (local_c8[2] * local_e8[2] + local_c8[0] * local_e8[0] + local_c8[1] * local_e8[1] <
            pRVar1->same_normal_tol)) {
          *allowed = 0;
          return 0;
        }
      }
      pRVar3 = ref_cell->ref_adj->item;
      iVar5 = pRVar3[(int)uVar8].next;
      uVar8 = (ulong)iVar5;
      if (uVar8 == 0xffffffffffffffff) {
        cell = -1;
      }
      else {
        cell = pRVar3[uVar8].ref;
      }
    } while (iVar5 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_collapse_edge_same_tangent(REF_GRID ref_grid,
                                                  REF_INT keep, REF_INT remove,
                                                  REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_edg(ref_grid);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT item, cell;
  REF_INT other, node, ixyz;
  REF_DBL tangent0[3], tangent1[3];
  REF_DBL dot;
  REF_STATUS status;

  *allowed = REF_TRUE;

  each_ref_cell_having_node(ref_cell, remove, item, cell) {
    /* a quad with keep and remove will be removed */
    if (keep == ref_cell_c2n(ref_cell, 0, cell) ||
        keep == ref_cell_c2n(ref_cell, 1, cell))
      continue;
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    other = REF_EMPTY;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      if (nodes[node] != remove) {
        other = nodes[node];
      }
    }
    RAS(REF_EMPTY != other, "other not found");
    for (ixyz = 0; ixyz < 3; ixyz++) {
      tangent0[ixyz] = ref_node_xyz(ref_node, ixyz, remove) -
                       ref_node_xyz(ref_node, ixyz, other);
      tangent1[ixyz] = ref_node_xyz(ref_node, ixyz, keep) -
                       ref_node_xyz(ref_node, ixyz, other);
    }
    RSS(ref_math_normalize(tangent0), "zero length orig quad");
    status = ref_math_normalize(tangent1);
    if (REF_DIV_ZERO == status) { /* new quad face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    dot = ref_math_dot(tangent0, tangent1);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}